

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall
tcu::x11::glx::GlxVisual::GlxVisual(GlxVisual *this,GlxDisplay *display,GLXFBConfig fbConfig)

{
  undefined8 *puVar1;
  ResourceError *this_00;
  
  this->m_display = display;
  this->m_visual = (Visual *)0x0;
  this->m_fbConfig = fbConfig;
  puVar1 = (undefined8 *)glXGetVisualFromFBConfig((display->super_XlibDisplay).m_display,fbConfig);
  if (puVar1 != (undefined8 *)0x0) {
    this->m_visual = (Visual *)*puVar1;
    XFree(puVar1);
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  ResourceError::ResourceError
            (this_00,"glXGetVisualFromFBConfig() returned NULL",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0x11e);
  __cxa_throw(this_00,&ResourceError::typeinfo,Exception::~Exception);
}

Assistant:

GlxVisual::GlxVisual (GlxDisplay& display, GLXFBConfig fbConfig)
	: m_display		(display)
	, m_visual		(DE_NULL)
	, m_fbConfig	(fbConfig)
{
	XVisualInfo* visualInfo = glXGetVisualFromFBConfig(getXDisplay(), fbConfig);

	if (!visualInfo)
		TCU_THROW(ResourceError, "glXGetVisualFromFBConfig() returned NULL");

	m_visual = visualInfo->visual;
	XFree(visualInfo);
}